

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_shading_language_include(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_shading_language_include != 0) {
    glad_glNamedStringARB = (PFNGLNAMEDSTRINGARBPROC)(*load)("glNamedStringARB");
    glad_glDeleteNamedStringARB = (PFNGLDELETENAMEDSTRINGARBPROC)(*load)("glDeleteNamedStringARB");
    glad_glCompileShaderIncludeARB =
         (PFNGLCOMPILESHADERINCLUDEARBPROC)(*load)("glCompileShaderIncludeARB");
    glad_glIsNamedStringARB = (PFNGLISNAMEDSTRINGARBPROC)(*load)("glIsNamedStringARB");
    glad_glGetNamedStringARB = (PFNGLGETNAMEDSTRINGARBPROC)(*load)("glGetNamedStringARB");
    glad_glGetNamedStringivARB = (PFNGLGETNAMEDSTRINGIVARBPROC)(*load)("glGetNamedStringivARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_shading_language_include(GLADloadproc load) {
	if(!GLAD_GL_ARB_shading_language_include) return;
	glad_glNamedStringARB = (PFNGLNAMEDSTRINGARBPROC)load("glNamedStringARB");
	glad_glDeleteNamedStringARB = (PFNGLDELETENAMEDSTRINGARBPROC)load("glDeleteNamedStringARB");
	glad_glCompileShaderIncludeARB = (PFNGLCOMPILESHADERINCLUDEARBPROC)load("glCompileShaderIncludeARB");
	glad_glIsNamedStringARB = (PFNGLISNAMEDSTRINGARBPROC)load("glIsNamedStringARB");
	glad_glGetNamedStringARB = (PFNGLGETNAMEDSTRINGARBPROC)load("glGetNamedStringARB");
	glad_glGetNamedStringivARB = (PFNGLGETNAMEDSTRINGIVARBPROC)load("glGetNamedStringivARB");
}